

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

wchar_t assertion_file_exists(char *filename,wchar_t line,char *f)

{
  int iVar1;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  iVar1 = access(f,0);
  if (iVar1 != 0) {
    failure_start(filename,line,"File should exist: %s",f);
    failure_finish(filename);
  }
  return (uint)(iVar1 == 0);
}

Assistant:

int
assertion_file_exists(const char *filename, int line, const char *f)
{
	assertion_count(filename, line);

#if defined(_WIN32) && !defined(__CYGWIN__)
	if (!_access(f, 0))
		return (1);
#else
	if (!access(f, F_OK))
		return (1);
#endif
	failure_start(filename, line, "File should exist: %s", f);
	failure_finish(NULL);
	return (0);
}